

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O2

vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
* __thiscall
deqp::gles2::Performance::anon_unknown_1::BinaryOpCase::generateProgramData
          (vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
           *__return_storage_ptr__,BinaryOpCase *this)

{
  string *__rhs;
  CaseType CVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int i_2;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  byte bVar11;
  ostringstream *poVar12;
  int i;
  int iVar13;
  int local_508;
  allocator<char> local_501;
  char *local_500;
  char *local_4f8;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  *local_4f0;
  char *local_4e8;
  BinaryOpCase *local_4e0;
  float local_4d8 [16];
  Vec4 local_498;
  Vec4 local_488;
  Vec4 local_478;
  Vec4 local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  string local_418;
  string description;
  ostringstream vtx;
  ostringstream frag;
  ProgramContext local_a8;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __rhs = &this->m_op;
  local_4f0 = __return_storage_ptr__;
  local_4e0 = this;
  for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
    CVar1 = (this->super_OperatorPerformanceCase).m_caseType;
    local_500 = glu::getPrecisionName(this->m_precision);
    pcVar9 = local_500;
    if (this->m_precision == PRECISION_LOWP) {
      pcVar9 = "mediump";
    }
    if (3 < this->m_type - TYPE_INT) {
      pcVar9 = local_500;
    }
    local_4f8 = glu::getDataTypeName(this->m_type);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
    poVar12 = (ostringstream *)&frag;
    if (CVar1 == CASETYPE_VERTEX) {
      poVar12 = (ostringstream *)&vtx;
    }
    std::operator<<((ostream *)&vtx,"attribute highp vec4 a_position;\n");
    for (iVar13 = 0; iVar13 != 5; iVar13 = iVar13 + 1) {
      poVar3 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"attribute ")
      ;
      poVar3 = std::operator<<(poVar3,pcVar9);
      poVar3 = std::operator<<(poVar3," vec4 a_in");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
      std::operator<<(poVar3,";\n");
    }
    if (CVar1 == CASETYPE_VERTEX) {
      std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                      "varying mediump vec4 v_color;\n");
      std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                      "varying mediump vec4 v_color;\n");
    }
    else {
      for (iVar13 = 0; iVar13 != 5; iVar13 = iVar13 + 1) {
        poVar3 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"varying ")
        ;
        poVar3 = std::operator<<(poVar3,pcVar9);
        poVar3 = std::operator<<(poVar3," vec4 v_in");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
        std::operator<<(poVar3,";\n");
        poVar3 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"varying "
                                );
        poVar3 = std::operator<<(poVar3,pcVar9);
        poVar3 = std::operator<<(poVar3," vec4 v_in");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
        std::operator<<(poVar3,";\n");
      }
    }
    std::operator<<((ostream *)poVar12,"uniform mediump int u_numLoopIterations;\n");
    if (CVar1 == CASETYPE_VERTEX) {
      std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                      "uniform mediump float u_zero;\n");
    }
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
    if (CVar1 != CASETYPE_VERTEX) {
      std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tgl_Position = a_position;\n");
    }
    std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
    std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
    local_4e8 = "v_";
    if (CVar1 == CASETYPE_VERTEX) {
      local_4e8 = "a_";
    }
    for (uVar7 = 0; uVar7 != 5; uVar7 = uVar7 + 1) {
      iVar13 = glu::getDataTypeScalarSize(this->m_type);
      bVar11 = 1;
      if (3 < this->m_type - TYPE_INT) {
        bVar11 = (local_4e0->m_useSwizzle ^ 1U) & this->m_type != TYPE_FLOAT_VEC4;
      }
      poVar3 = std::operator<<((ostream *)poVar12,"\t");
      poVar3 = std::operator<<(poVar3,local_500);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,local_4f8);
      poVar3 = std::operator<<(poVar3," in");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar7);
      std::operator<<(poVar3," = ");
      if (bVar11 != 0) {
        poVar3 = std::operator<<((ostream *)poVar12,local_4f8);
        std::operator<<(poVar3,"(");
      }
      poVar3 = std::operator<<((ostream *)poVar12,local_4e8);
      poVar3 = std::operator<<(poVar3,"in");
      std::ostream::operator<<(poVar3,uVar7);
      if (local_4e0->m_useSwizzle == true) {
        poVar3 = std::operator<<((ostream *)poVar12,".");
        std::operator<<(poVar3,*(char **)(s_swizzles +
                                         (long)(iVar13 + -1) * 8 + (ulong)((uVar7 & 3) << 5)));
      }
      if (bVar11 != 0) {
        std::operator<<((ostream *)poVar12,")");
      }
      std::operator<<((ostream *)poVar12,";\n");
      this = local_4e0;
    }
    iVar13 = 0;
    while (iVar13 != 4) {
      poVar3 = std::operator<<((ostream *)poVar12,"\t");
      poVar3 = std::operator<<(poVar3,local_500);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,local_4f8);
      poVar3 = std::operator<<(poVar3," acc");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
      poVar3 = std::operator<<(poVar3,"a");
      poVar3 = std::operator<<(poVar3," = in");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
      std::operator<<(poVar3,";\n");
      poVar3 = std::operator<<((ostream *)poVar12,"\t");
      poVar3 = std::operator<<(poVar3,local_500);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,local_4f8);
      poVar3 = std::operator<<(poVar3," acc");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
      poVar3 = std::operator<<(poVar3,"b");
      poVar3 = std::operator<<(poVar3," = in");
      iVar13 = iVar13 + 1;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
      std::operator<<(poVar3,";\n");
    }
    std::operator<<((ostream *)poVar12,"\tfor (int i = 0; i < u_numLoopIterations; i++)\n");
    std::operator<<((ostream *)poVar12,"\t{\n");
    local_4e8 = (char *)CONCAT44(local_4e8._4_4_,(uint)(iVar2 != 1) * 2 + 2);
    for (iVar13 = 0; iVar13 != (int)local_4e8; iVar13 = iVar13 + 1) {
      for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
        if (iVar8 != 0 || iVar13 != 0) {
          std::operator<<((ostream *)poVar12,"\n");
        }
        poVar3 = std::operator<<((ostream *)poVar12,"\t\tacc");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3,"a = acc");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3,"b ");
        poVar3 = std::operator<<(poVar3,(string *)__rhs);
        poVar3 = std::operator<<(poVar3," acc");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3,"a");
        std::operator<<(poVar3,";\n");
        poVar3 = std::operator<<((ostream *)poVar12,"\t\tacc");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3,"b = acc");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3,"a ");
        poVar3 = std::operator<<(poVar3,(string *)__rhs);
        poVar3 = std::operator<<(poVar3," acc");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
        poVar3 = std::operator<<(poVar3,"b");
        std::operator<<(poVar3,";\n");
      }
    }
    std::operator<<((ostream *)poVar12,"\t}\n");
    std::operator<<((ostream *)poVar12,"\n");
    poVar3 = std::operator<<((ostream *)poVar12,"\t");
    poVar3 = std::operator<<(poVar3,local_500);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,local_4f8);
    std::operator<<(poVar3," res =");
    for (iVar13 = 0; iVar13 != 4; iVar13 = iVar13 + 1) {
      if (iVar13 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&description,glcts::fixed_sample_locations_values + 1,&local_501);
      }
      else {
        std::operator+(&description," ",__rhs);
      }
      poVar3 = std::operator<<((ostream *)poVar12,(string *)&description);
      poVar3 = std::operator<<(poVar3," acc");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
      std::operator<<(poVar3,"b");
      std::__cxx11::string::~string((string *)&description);
    }
    std::operator<<((ostream *)poVar12,";\n");
    std::operator<<((ostream *)poVar12,"\tmediump vec4 color = ");
    if (this->m_type == TYPE_FLOAT_VEC4) {
      std::operator<<((ostream *)poVar12,"res");
    }
    else {
      iVar13 = glu::getDataTypeScalarSize(this->m_type);
      std::operator<<((ostream *)poVar12,"vec4(res");
      for (; iVar13 < 4; iVar13 = iVar13 + 1) {
        poVar3 = std::operator<<((ostream *)poVar12,", ");
        pcVar9 = "0.0";
        if (iVar13 == 3) {
          pcVar9 = "1.0";
        }
        std::operator<<(poVar3,pcVar9);
      }
      std::operator<<((ostream *)poVar12,")");
    }
    std::operator<<((ostream *)poVar12,";\n");
    poVar3 = std::operator<<((ostream *)poVar12,"\t");
    pcVar9 = "gl_FragColor";
    if (CVar1 == CASETYPE_VERTEX) {
      pcVar9 = "v_color";
    }
    poVar3 = std::operator<<(poVar3,pcVar9);
    std::operator<<(poVar3," = color;\n");
    if (CVar1 == CASETYPE_VERTEX) {
      std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tgl_Position = a_position + u_zero*color;\n");
      std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tgl_FragColor = v_color;\n");
    }
    else {
      for (iVar13 = 0; iVar13 != 5; iVar13 = iVar13 + 1) {
        poVar3 = std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_in");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
        poVar3 = std::operator<<(poVar3," = a_in");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar13);
        std::operator<<(poVar3,";\n");
      }
    }
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
    std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
    attributes.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    attributes.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    attributes.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (local_508 = 0; local_508 < 5; local_508 = local_508 + 1) {
      de::toString<int>(&local_418,&local_508);
      std::operator+(&local_458,"a_in",&local_418);
      local_4d8[0xc] = 2.0;
      local_4d8[0xd] = 2.0;
      local_4d8[0xe] = 2.0;
      local_4d8[0xf] = 1.0;
      lVar4 = (long)(local_508 % 4);
      lVar5 = (long)((local_508 + 1) % 4);
      lVar10 = (long)((local_508 + 2) % 4);
      lVar6 = (long)((local_508 + 3) % 4);
      local_468.m_data[0] = local_4d8[lVar4 + 0xc];
      local_468.m_data[1] = local_4d8[lVar5 + 0xc];
      local_468.m_data[2] = local_4d8[lVar10 + 0xc];
      local_468.m_data[3] = local_4d8[lVar6 + 0xc];
      local_4d8[8] = 1.0;
      local_4d8[9] = 2.0;
      local_4d8[10] = 1.0;
      local_4d8[0xb] = 2.0;
      local_478.m_data[0] = local_4d8[lVar4 + 8];
      local_478.m_data[1] = local_4d8[lVar5 + 8];
      local_478.m_data[2] = local_4d8[lVar10 + 8];
      local_478.m_data[3] = local_4d8[lVar6 + 8];
      local_4d8[4] = 2.0;
      local_4d8[5] = 1.0;
      local_4d8[6] = 2.0;
      local_4d8[7] = 2.0;
      local_488.m_data[0] = local_4d8[lVar4 + 4];
      local_488.m_data[1] = local_4d8[lVar5 + 4];
      local_488.m_data[2] = local_4d8[lVar10 + 4];
      local_488.m_data[3] = local_4d8[lVar6 + 4];
      local_4d8[0] = 1.0;
      local_4d8[1] = 1.0;
      local_4d8[2] = 2.0;
      local_4d8[3] = 1.0;
      local_498.m_data[0] = local_4d8[lVar4];
      local_498.m_data[1] = local_4d8[lVar5];
      local_498.m_data[2] = local_4d8[lVar10];
      local_498.m_data[3] = local_4d8[lVar6];
      OperatorPerformanceCase::AttribSpec::AttribSpec
                ((AttribSpec *)&description,local_458._M_dataplus._M_p,&local_468,&local_478,
                 &local_488,&local_498);
      std::
      vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
      ::push_back(&attributes,(AttribSpec *)&description);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_418);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&description,"This is the program with the ",(allocator<char> *)&local_458)
    ;
    std::__cxx11::string::append((char *)&description);
    std::__cxx11::string::append((char *)&description);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    OperatorPerformanceCase::ProgramContext::ProgramContext
              (&local_a8,&local_458,&local_418,&attributes,&description);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&description);
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ::~vector(&attributes);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
    ::push_back(local_4f0,&local_a8);
    OperatorPerformanceCase::ProgramContext::~ProgramContext(&local_a8);
  }
  return local_4f0;
}

Assistant:

vector<BinaryOpCase::ProgramContext> BinaryOpCase::generateProgramData (void) const
{
	vector<ProgramContext> progData;
	for (int i = 0; i < PROGRAM_LAST; i++)
		progData.push_back(generateSingleProgramData((ProgramID)i));
	return progData;
}